

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_map_suite.cpp
# Opt level: O2

void api_suite::run(void)

{
  api_ctor_default();
  api_ctor_array();
  api_make();
  api_size();
  api_contains();
  api_lower_bound();
  api_find();
  return;
}

Assistant:

void run()
{
    api_ctor_default();
    api_ctor_array();
    api_make();
    api_size();
    api_contains();
    api_lower_bound();
    api_find();
}